

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# klass_register.cpp
# Opt level: O1

void __thiscall
HawkTracer::parser::KlassRegister::_add_klass
          (KlassRegister *this,
          unique_ptr<HawkTracer::parser::EventKlass,_std::default_delete<HawkTracer::parser::EventKlass>_>
          *klass)

{
  uint uVar1;
  ulong uVar2;
  _Hash_node_base *p_Var3;
  int iVar4;
  __hash_code __code;
  ulong uVar5;
  __node_base_ptr p_Var6;
  __node_base_ptr p_Var7;
  pointer *__ptr;
  uint local_28 [2];
  EventKlass *local_20;
  
  iVar4 = pthread_mutex_lock((pthread_mutex_t *)this);
  if (iVar4 != 0) {
    std::__throw_system_error(iVar4);
  }
  uVar1 = ((klass->_M_t).
           super___uniq_ptr_impl<HawkTracer::parser::EventKlass,_std::default_delete<HawkTracer::parser::EventKlass>_>
           ._M_t.
           super__Tuple_impl<0UL,_HawkTracer::parser::EventKlass_*,_std::default_delete<HawkTracer::parser::EventKlass>_>
           .super__Head_base<0UL,_HawkTracer::parser::EventKlass_*,_false>._M_head_impl)->_id;
  uVar2 = (this->_register)._M_h._M_bucket_count;
  uVar5 = (ulong)uVar1 % uVar2;
  p_Var6 = (this->_register)._M_h._M_buckets[uVar5];
  p_Var7 = (__node_base_ptr)0x0;
  if ((p_Var6 != (__node_base_ptr)0x0) &&
     (p_Var3 = p_Var6->_M_nxt, p_Var7 = p_Var6, uVar1 != *(uint *)&p_Var6->_M_nxt[1]._M_nxt)) {
    while (p_Var6 = p_Var3, p_Var3 = p_Var6->_M_nxt, p_Var3 != (_Hash_node_base *)0x0) {
      p_Var7 = (__node_base_ptr)0x0;
      if (((ulong)*(uint *)&p_Var3[1]._M_nxt % uVar2 != uVar5) ||
         (p_Var7 = p_Var6, uVar1 == *(uint *)&p_Var3[1]._M_nxt)) goto LAB_0010e93b;
    }
    p_Var7 = (__node_base_ptr)0x0;
  }
LAB_0010e93b:
  if ((p_Var7 == (__node_base_ptr)0x0) || (p_Var7->_M_nxt == (_Hash_node_base *)0x0)) {
    local_20 = (klass->_M_t).
               super___uniq_ptr_impl<HawkTracer::parser::EventKlass,_std::default_delete<HawkTracer::parser::EventKlass>_>
               ._M_t.
               super__Tuple_impl<0UL,_HawkTracer::parser::EventKlass_*,_std::default_delete<HawkTracer::parser::EventKlass>_>
               .super__Head_base<0UL,_HawkTracer::parser::EventKlass_*,_false>._M_head_impl;
    (klass->_M_t).
    super___uniq_ptr_impl<HawkTracer::parser::EventKlass,_std::default_delete<HawkTracer::parser::EventKlass>_>
    ._M_t.
    super__Tuple_impl<0UL,_HawkTracer::parser::EventKlass_*,_std::default_delete<HawkTracer::parser::EventKlass>_>
    .super__Head_base<0UL,_HawkTracer::parser::EventKlass_*,_false>._M_head_impl = (EventKlass *)0x0
    ;
    local_28[0] = uVar1;
    std::
    _Hashtable<unsigned_int,std::pair<unsigned_int_const,std::shared_ptr<HawkTracer::parser::EventKlass>>,std::allocator<std::pair<unsigned_int_const,std::shared_ptr<HawkTracer::parser::EventKlass>>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
    ::
    _M_emplace<std::pair<unsigned_int,std::unique_ptr<HawkTracer::parser::EventKlass,std::default_delete<HawkTracer::parser::EventKlass>>>>
              ((_Hashtable<unsigned_int,std::pair<unsigned_int_const,std::shared_ptr<HawkTracer::parser::EventKlass>>,std::allocator<std::pair<unsigned_int_const,std::shared_ptr<HawkTracer::parser::EventKlass>>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                *)&this->_register,local_28);
    if (local_20 != (EventKlass *)0x0) {
      std::default_delete<HawkTracer::parser::EventKlass>::operator()
                ((default_delete<HawkTracer::parser::EventKlass> *)&local_20,local_20);
    }
  }
  pthread_mutex_unlock((pthread_mutex_t *)this);
  return;
}

Assistant:

void KlassRegister::_add_klass(std::unique_ptr<EventKlass> klass)
{
    lock_guard l(_register_mtx);
    if (_register.find(klass->get_id()) == _register.end())
    {
        _register.insert(std::make_pair(klass->get_id(), std::move(klass)));
    }
}